

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

double pidAngle(double now)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = atan2(orient.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                .array[0] -
                obs.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array[0],-(orient.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                           m_storage.m_data.array[1] -
                          obs.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                          .m_data.array[1]));
  dVar2 = dVar1 - now;
  if ((now <= 2.5) || (-2.5 <= dVar1)) {
    if ((now < -2.5) && (2.5 < dVar1)) {
      dVar2 = dVar2 + -6.283185307179586;
    }
  }
  else {
    dVar2 = dVar2 + 6.283185307179586;
  }
  dVar3 = pidAngle::accum * 0.0001;
  dVar1 = dVar2 - pidAngle::old_diff;
  pidAngle::accum = pidAngle::accum + dVar2;
  pidAngle::old_diff = dVar2;
  return dVar1 * 0.001 + dVar2 * 0.2 + dVar3;
}

Assistant:

double pidAngle(double now) {
    Eigen::Vector2d vec = orient - obs;
    double target = atan2(vec.x(), -vec.y());
    static double old_diff = 0.0, accum = 0.0;
    double diff = target - now;
    if (now > 2.5 && target < -2.5) {
        diff += 2 * M_PI;
    } else if (now < -2.5 && target > 2.5) {
        diff -= 2 * M_PI;
    }
    double result = K_P * diff + K_I * accum + K_D * (diff - old_diff);
    accum += diff;
    old_diff = diff;
    return result;
}